

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O0

string * __thiscall
jbcoin::STInteger<unsigned_char>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_char> *this)

{
  bool bVar1;
  SField *this_00;
  uchar extraout_DL;
  uchar extraout_DL_00;
  uchar in;
  Stream local_200;
  ScopedStream local_1f0;
  Stream local_60;
  int local_50;
  byte local_39;
  undefined1 local_38 [8];
  string token;
  STInteger<unsigned_char> *this_local;
  string *human;
  
  token.field_2._8_8_ = this;
  this_00 = STBase::getFName(&this->super_STBase);
  bVar1 = SField::operator==(this_00,(SField *)sfTransactionResult);
  in = extraout_DL;
  if (bVar1) {
    std::__cxx11::string::string((string *)local_38);
    local_39 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    bVar1 = transResultInfo((uint)this->value_,(string *)local_38,__return_storage_ptr__);
    if (bVar1) {
      local_39 = 1;
      local_50 = 1;
    }
    else {
      debugLog();
      beast::Journal::error((Journal *)&local_60);
      bVar1 = beast::Journal::Stream::operator_cast_to_bool(&local_60);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        debugLog();
        beast::Journal::error((Journal *)&local_200);
        beast::Journal::Stream::operator<<
                  (&local_1f0,&local_200,(char (*) [34])"Unknown result code in metadata: ");
        beast::Journal::ScopedStream::operator<<(&local_1f0,&this->value_);
        beast::Journal::ScopedStream::~ScopedStream(&local_1f0);
      }
      local_50 = 0;
    }
    if ((local_39 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_38);
    in = extraout_DL_00;
    if (local_50 != 0) {
      return __return_storage_ptr__;
    }
  }
  beast::lexicalCastThrow<std::__cxx11::string,unsigned_char>
            (__return_storage_ptr__,(beast *)(ulong)this->value_,in);
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt8::getText () const
{
    if (getFName () == sfTransactionResult)
    {
        std::string token, human;

        if (transResultInfo (static_cast<TER> (value_), token, human))
            return human;

        JLOG (debugLog().error())
            << "Unknown result code in metadata: " << value_;
    }

    return beast::lexicalCastThrow <std::string> (value_);
}